

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall CVmRun::do_throw(CVmRun *this,uchar *pc,vm_obj_id_t exception_obj)

{
  int iVar1;
  uint uVar2;
  vm_obj_id_t vVar3;
  vm_obj_id_t vVar4;
  vm_obj_id_t in_EDX;
  uchar *in_RSI;
  CVmRun *in_RDI;
  CVmExcEntryPtr entry;
  size_t i;
  size_t cnt;
  uint ofs;
  uchar *func_start;
  CVmExcTablePtr tab;
  CVmExcEntryPtr *in_stack_ffffffffffffff88;
  uchar *puVar5;
  CVmRun *in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  CVmExcEntryPtr local_50;
  ulong local_48;
  ulong local_40;
  uint local_34;
  uchar *local_30;
  vm_obj_id_t local_1c;
  uchar *local_18;
  
  local_1c = in_EDX;
  local_18 = in_RSI;
  do {
    local_30 = entry_ptr_native_;
    if ((entry_ptr_native_ != (uchar *)0x0) &&
       (iVar1 = CVmExcTablePtr::set((CVmExcTablePtr *)in_RDI,
                                    (uchar *)CONCAT44(in_stack_ffffffffffffffa4,
                                                      in_stack_ffffffffffffffa0)), iVar1 != 0)) {
      local_34 = (int)local_18 - (int)local_30;
      CVmExcTablePtr::set_entry_ptr
                ((CVmExcTablePtr *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,0x234c20);
      local_48 = 0;
      local_40 = CVmExcTablePtr::get_count((CVmExcTablePtr *)0x234c33);
      while (local_48 < local_40) {
        in_stack_ffffffffffffffa4 = local_34;
        uVar2 = CVmExcEntryPtr::get_start_ofs((CVmExcEntryPtr *)0x234c5a);
        if ((uVar2 <= in_stack_ffffffffffffffa4) &&
           (in_stack_ffffffffffffffa0 = local_34,
           uVar2 = CVmExcEntryPtr::get_end_ofs((CVmExcEntryPtr *)0x234c7a),
           in_stack_ffffffffffffffa0 <= uVar2)) {
          vVar3 = CVmExcEntryPtr::get_exception((CVmExcEntryPtr *)0x234c92);
          vVar4 = local_1c;
          if ((vVar3 == 0) ||
             (vVar3 = CVmExcEntryPtr::get_exception((CVmExcEntryPtr *)0x234ca9), vVar4 == vVar3)) {
LAB_00234cdd:
            puVar5 = local_30;
            uVar2 = CVmExcEntryPtr::get_handler_ofs((CVmExcEntryPtr *)0x234cf0);
            local_18 = puVar5 + uVar2;
            push_obj(in_stack_ffffffffffffff90,(vm_obj_id_t)((ulong)puVar5 >> 0x20));
            return local_18;
          }
          in_stack_ffffffffffffff90 = (CVmRun *)vm_objp(0);
          vVar4 = CVmExcEntryPtr::get_exception((CVmExcEntryPtr *)0x234ccb);
          iVar1 = (*(code *)(in_stack_ffffffffffffff90->super_CVmStack).arr_[3].val)
                            (in_stack_ffffffffffffff90,(ulong)vVar4);
          if (iVar1 != 0) goto LAB_00234cdd;
        }
        local_48 = local_48 + 1;
        CVmExcEntryPtr::inc(&local_50);
      }
    }
    if (frame_ptr_ == (vm_val_t *)0x0) {
      return (uchar *)0x0;
    }
    local_18 = do_return(in_RDI);
    if (local_18 == (uchar *)0x0) {
      return (uchar *)0x0;
    }
  } while( true );
}

Assistant:

const uchar *CVmRun::do_throw(VMG_ const uchar *pc, vm_obj_id_t exception_obj)
{
    /*
     *   Search the stack for a handler for this exception class.  Start
     *   at the current stack frame; if we find a handler here, use it;
     *   otherwise, unwind the stack to the enclosing frame and search for
     *   a handler there; repeat until we exhaust the stack.  
     */
    for (;;)
    {
        CVmExcTablePtr tab;
        const uchar *func_start;
        uint ofs;

        /* get a pointer to the start of the current function */
        func_start = entry_ptr_native_;

        /* set up a pointer to the current exception table */
        if (func_start != 0 && tab.set(func_start))
        {
            size_t cnt;
            size_t i;
            CVmExcEntryPtr entry;

            /* calculate our offset in the current function */
            ofs = pc - func_start;

            /* set up a pointer to the first table entry */
            tab.set_entry_ptr(vmg_ &entry, 0);
            
            /* loop through the entries */
            for (i = 0, cnt = tab.get_count() ; i < cnt ;
                 ++i, entry.inc(vmg0_))
            {
                /* 
                 *   Check to see if we're in the range for this entry.
                 *   If this entry covers the appropriate range, and the
                 *   exception we're handling is of the class handled by
                 *   this exception (or derives from that class), this
                 *   handler handles this exception. 
                 */
                if (ofs >= entry.get_start_ofs()
                    && ofs <= entry.get_end_ofs()
                    && (entry.get_exception() == VM_INVALID_OBJ
                        || exception_obj == entry.get_exception()
                        || (vm_objp(vmg_ exception_obj)
                            ->is_instance_of(vmg_ entry.get_exception()))))
                {
                    /* 
                     *   this is it - move the program counter to the
                     *   first byte of the handler's code 
                     */
                    pc = func_start + entry.get_handler_ofs();

                    /* push the exception so that the handler can get at it */
                    push_obj(vmg_ exception_obj);

                    /* return the new program counter at which to resume */
                    return pc;
                }
            }
        }

        /* 
         *   We didn't find a handler in the current function - unwind the
         *   stack one level, using an ordinary RETURN operation (we're not
         *   really returning, though, so we don't need to provide a return
         *   value).  First, though, check to make sure there is an enclosing
         *   frame at all - if there's not, we can simply return immediately.
         */
        if (frame_ptr_ == 0)
        {
            /* there's no enclosing frame, so there's nowhere to go */
            return 0;
        }

        /* try unwinding the stack a level */
        if ((pc = do_return(vmg0_)) == 0)
        {
            /* 
             *   The enclosing frame is a recursive invocation, so we cannot
             *   unwind any further at this point.  Return null to indicate
             *   that the exception was not handled and should be thrown out
             *   of the current recursive VM invocation.  
             */
            return 0;
        }
    }
}